

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall Camera::m_init(Camera *this)

{
  double dVar1;
  Bmp *this_00;
  Color local_98;
  Vector3 local_80;
  Vector3 local_68;
  Vector3 local_50;
  Vector3 local_38;
  
  dVar1 = tan(this->m_fovy);
  Vector3::operator*(&local_80,&this->m_up,dVar1);
  Vector3::operator*((Vector3 *)&local_98,&local_80,-this->m_dist);
  (this->m_dh).z = local_98.b;
  (this->m_dh).x = local_98.r;
  (this->m_dh).y = local_98.g;
  operator*(&this->m_dh,&this->m_dir);
  Vector3::unitize(&local_50,&local_68);
  dVar1 = tan(this->m_fovy);
  Vector3::operator*(&local_38,&local_50,dVar1);
  Vector3::operator*(&local_80,&local_38,this->m_dist);
  Vector3::operator*((Vector3 *)&local_98,&local_80,(double)this->m_w / (double)this->m_h);
  (this->m_dw).z = local_98.b;
  (this->m_dw).x = local_98.r;
  (this->m_dw).y = local_98.g;
  this_00 = (Bmp *)operator_new(0x46);
  local_98.r = 0.0;
  local_98.g = 0.0;
  local_98.b = 0.0;
  Bmp::Bmp(this_00,this->m_w,this->m_h,&local_98);
  this->m_film = this_00;
  return;
}

Assistant:

void Camera::m_init()
{
    m_dh = m_up * tan(m_fovy) * -m_dist;
    m_dw = (m_dh * m_dir).unitize() * tan(m_fovy) * m_dist * (1.0 * m_w / m_h);
    m_film = new Bmp(m_w, m_h);
}